

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::measure_environment<std::chrono::_V2::steady_clock>(void)

{
  undefined8 uVar1;
  rep rVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *pEVar10;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> cost;
  EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> resolution;
  EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_58;
  EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_38;
  
  if (measure_environment<std::chrono::_V2::steady_clock>::env ==
      (Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)0x0) {
    iVar9 = warmup<std::chrono::_V2::steady_clock>();
    estimate_clock_resolution<std::chrono::_V2::steady_clock>(&local_38,iVar9);
    estimate_clock_cost<std::chrono::_V2::steady_clock>
              (&local_58,(FloatDuration<std::chrono::_V2::steady_clock>)local_38.mean.__r);
    pEVar10 = (Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
              operator_new(0x40);
    (pEVar10->clock_resolution).outliers.low_severe = local_38.outliers.low_severe;
    (pEVar10->clock_resolution).outliers.low_mild = local_38.outliers.low_mild;
    (pEVar10->clock_resolution).outliers.high_mild = local_38.outliers.high_mild;
    (pEVar10->clock_resolution).outliers.high_severe = local_38.outliers.high_severe;
    (pEVar10->clock_resolution).mean.__r = local_38.mean.__r;
    (pEVar10->clock_resolution).outliers.samples_seen = local_38.outliers.samples_seen;
    (pEVar10->clock_resolution).outliers.low_severe = local_38.outliers.low_severe;
    (pEVar10->clock_cost).mean.__r = local_58.mean.__r;
    (pEVar10->clock_cost).outliers.samples_seen = local_58.outliers.samples_seen;
    (pEVar10->clock_cost).outliers.low_severe = local_58.outliers.low_severe;
    (pEVar10->clock_cost).outliers.low_severe = local_58.outliers.low_severe;
    (pEVar10->clock_cost).outliers.low_mild = local_58.outliers.low_mild;
    (pEVar10->clock_cost).outliers.high_mild = local_58.outliers.high_mild;
    (pEVar10->clock_cost).outliers.high_severe = local_58.outliers.high_severe;
    iVar9 = (pEVar10->clock_resolution).outliers.high_mild;
    uVar1 = *(undefined8 *)&(pEVar10->clock_resolution).outliers.high_severe;
    rVar2 = (pEVar10->clock_cost).mean.__r;
    iVar5 = (pEVar10->clock_cost).outliers.samples_seen;
    iVar6 = (pEVar10->clock_cost).outliers.low_severe;
    iVar13 = (pEVar10->clock_cost).outliers.low_mild;
    iVar4 = (pEVar10->clock_cost).outliers.high_mild;
    uVar3 = *(undefined8 *)&(pEVar10->clock_cost).outliers.high_severe;
    measure_environment<std::chrono::_V2::steady_clock>::env = pEVar10;
    (in_RDI->clock_resolution).outliers.low_mild = (pEVar10->clock_resolution).outliers.low_mild;
    (in_RDI->clock_resolution).outliers.high_mild = iVar9;
    *(undefined8 *)&(in_RDI->clock_resolution).outliers.high_severe = uVar1;
    (in_RDI->clock_cost).outliers.low_mild = iVar13;
    (in_RDI->clock_cost).outliers.high_mild = iVar4;
    *(undefined8 *)&(in_RDI->clock_cost).outliers.high_severe = uVar3;
    (in_RDI->clock_cost).mean.__r = rVar2;
    (in_RDI->clock_cost).outliers.samples_seen = iVar5;
    (in_RDI->clock_cost).outliers.low_severe = iVar6;
    uVar11 = *(undefined4 *)&(pEVar10->clock_resolution).mean.__r;
    uVar12 = *(undefined4 *)((long)&(pEVar10->clock_resolution).mean.__r + 4);
    iVar9 = (pEVar10->clock_resolution).outliers.samples_seen;
    iVar13 = (pEVar10->clock_resolution).outliers.low_severe;
  }
  else {
    uVar11 = *(undefined4 *)
              &(measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).mean.__r
    ;
    uVar12 = *(undefined4 *)
              ((long)&(measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).
                      mean.__r + 4);
    iVar9 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.
            samples_seen;
    iVar13 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.
             low_severe;
    iVar7 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.
            low_mild;
    iVar8 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.
            high_mild;
    uVar1 = *(undefined8 *)
             &(measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.
              high_severe;
    rVar2 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).mean.__r;
    iVar5 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.
            samples_seen;
    iVar6 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.
            low_severe;
    iVar4 = (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.
            high_mild;
    uVar3 = *(undefined8 *)
             &(measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.
              high_severe;
    (in_RDI->clock_cost).outliers.low_mild =
         (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.low_mild;
    (in_RDI->clock_cost).outliers.high_mild = iVar4;
    *(undefined8 *)&(in_RDI->clock_cost).outliers.high_severe = uVar3;
    (in_RDI->clock_cost).mean.__r = rVar2;
    (in_RDI->clock_cost).outliers.samples_seen = iVar5;
    (in_RDI->clock_cost).outliers.low_severe = iVar6;
    (in_RDI->clock_resolution).outliers.low_mild = iVar7;
    (in_RDI->clock_resolution).outliers.high_mild = iVar8;
    *(undefined8 *)&(in_RDI->clock_resolution).outliers.high_severe = uVar1;
  }
  *(undefined4 *)&(in_RDI->clock_resolution).mean.__r = uVar11;
  *(undefined4 *)((long)&(in_RDI->clock_resolution).mean.__r + 4) = uVar12;
  (in_RDI->clock_resolution).outliers.samples_seen = iVar9;
  (in_RDI->clock_resolution).outliers.low_severe = iVar13;
  return in_RDI;
}

Assistant:

Environment<FloatDuration<Clock>> measure_environment() {
                static Environment<FloatDuration<Clock>>* env = nullptr;
                if (env) {
                    return *env;
                }

                auto iters = Detail::warmup<Clock>();
                auto resolution = Detail::estimate_clock_resolution<Clock>(iters);
                auto cost = Detail::estimate_clock_cost<Clock>(resolution.mean);

                env = new Environment<FloatDuration<Clock>>{ resolution, cost };
                return *env;
            }